

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O2

Dch_Cla_t * Dch_CreateCandEquivClasses(Aig_Man_t *pAig,int nWords,int fVerbose)

{
  uint uVar1;
  void **ppvVar2;
  ulong uVar3;
  Vec_Ptr_t *vSims;
  Dch_Cla_t *p;
  ulong uVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  
  uVar1 = pAig->vObjs->nSize;
  ppvVar2 = (void **)malloc(((long)nWords * 4 + 8) * (long)(int)uVar1);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  lVar5 = (long)(int)uVar1 << 3;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    ppvVar2[uVar3] = (void *)((long)ppvVar2 + lVar5);
    lVar5 = lVar5 + (long)nWords * 4;
  }
  vSims = (Vec_Ptr_t *)malloc(0x10);
  vSims->nSize = uVar1;
  vSims->nCap = uVar1;
  vSims->pArray = ppvVar2;
  Dch_PerformRandomSimulation(pAig,vSims);
  p = Dch_ClassesStart(pAig);
  Dch_ClassesSetData(p,vSims,Dch_NodeHash,Dch_NodeIsConst,Dch_NodesAreEqual);
  Dch_ClassesPrepare(p,0,0);
  iVar6 = 7;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    Dch_PerformRandomSimulation(pAig,vSims);
    Dch_ClassesRefine(p);
  }
  free(vSims->pArray);
  free(vSims);
  Dch_ClassesSetData(p,(void *)0x0,(_func_uint_void_ptr_Aig_Obj_t_ptr *)0x0,Dch_NodeIsConstCex,
                     Dch_NodesAreEqualCex);
  return p;
}

Assistant:

Dch_Cla_t * Dch_CreateCandEquivClasses( Aig_Man_t * pAig, int nWords, int fVerbose )
{
    Dch_Cla_t * pClasses;
    Vec_Ptr_t * vSims;
    int i;
    // allocate simulation information
    vSims = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), nWords );
    // run random simulation from the primary inputs
    Dch_PerformRandomSimulation( pAig, vSims );
    // start storage for equivalence classes
    pClasses = Dch_ClassesStart( pAig );
    Dch_ClassesSetData( pClasses, vSims, Dch_NodeHash, Dch_NodeIsConst, Dch_NodesAreEqual );
    // hash nodes by sim info
    Dch_ClassesPrepare( pClasses, 0, 0 );
    // iterate random simulation
    for ( i = 0; i < 7; i++ )
    {
        Dch_PerformRandomSimulation( pAig, vSims );
        Dch_ClassesRefine( pClasses );
    }
    // clean up and return
    Vec_PtrFree( vSims );
    // prepare class refinement procedures
    Dch_ClassesSetData( pClasses, NULL, NULL, Dch_NodeIsConstCex, Dch_NodesAreEqualCex );
    return pClasses;
}